

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Bool CanApplyBlockStyle(Node *node)

{
  Dict *pDVar1;
  Bool BVar2;
  
  BVar2 = prvTidynodeHasCM(node,0xe8);
  if ((BVar2 == no) ||
     (((BVar2 = yes, node != (Node *)0x0 && (pDVar1 = node->tag, pDVar1 != (Dict *)0x0)) &&
      ((pDVar1->id == TidyTag_DIV ||
       ((pDVar1 != (Dict *)0x0 &&
        ((pDVar1->id == TidyTag_P ||
         ((pDVar1 != (Dict *)0x0 &&
          ((pDVar1->id == TidyTag_TABLE ||
           ((pDVar1 != (Dict *)0x0 &&
            ((pDVar1->id == TidyTag_TR || ((pDVar1 != (Dict *)0x0 && (pDVar1->id == TidyTag_LI))))))
           )))))))))))))) {
    BVar2 = no;
  }
  return BVar2;
}

Assistant:

static Bool CanApplyBlockStyle( Node *node )
{
    if (TY_(nodeHasCM)(node,CM_BLOCK | CM_LIST | CM_DEFLIST | CM_TABLE)
        && !nodeIsDIV(node) && !nodeIsP(node)
        && !nodeIsTABLE(node) && !nodeIsTR(node) && !nodeIsLI(node) )
    {
        return yes;
    }
    return no;
}